

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86Jcc(uchar *stream,uint labelID,x86Cond cond,bool isNear)

{
  int iVar1;
  undefined3 in_register_00000009;
  UnsatisfiedJump local_18;
  
  if (CONCAT31(in_register_00000009,isNear) == 0) {
    *stream = condCode[cond] + 'p';
    iVar1 = 2;
  }
  else {
    *stream = '\x0f';
    stream[1] = condCode[cond] + 0x80;
    iVar1 = 6;
  }
  local_18.labelID = labelID & 0x7fffffff;
  local_18.isNear = isNear;
  local_18.jmpPos = stream;
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_18);
  return iVar1;
}

Assistant:

int x86Jcc(unsigned char *stream, unsigned int labelID, x86Cond cond, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
	{
		stream[0] = 0x0f;
		stream[1] = 0x80 + condCode[cond];
	}else{
		stream[0] = 0x70 + condCode[cond];
	}

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 6 : 2);
}